

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintMessageEnd_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,Message *message,int field_index,
          int field_count,bool single_line_mode)

{
  undefined1 local_58 [8];
  StringBaseTextGenerator generator;
  bool single_line_mode_local;
  int field_count_local;
  int field_index_local;
  Message *message_local;
  FieldValuePrinter *this_local;
  
  generator.output_.field_2._M_local_buf[0xf] = single_line_mode;
  anon_unknown_14::StringBaseTextGenerator::StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_58);
  FastFieldValuePrinter::PrintMessageEnd
            (&this->delegate_,message,field_index,field_count,
             (bool)(generator.output_.field_2._M_local_buf[0xf] & 1),(BaseTextGenerator *)local_58);
  protobuf::(anonymous_namespace)::StringBaseTextGenerator::Consume_abi_cxx11_
            (__return_storage_ptr__,local_58);
  anon_unknown_14::StringBaseTextGenerator::~StringBaseTextGenerator
            ((StringBaseTextGenerator *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintMessageEnd(
    const Message& message, int field_index, int field_count,
    bool single_line_mode) const {
  FORWARD_IMPL(PrintMessageEnd, message, field_index, field_count,
               single_line_mode);
}